

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

size_t CalculateBlockSymbolSizeGivenCounts
                 (size_t *ll_counts,size_t *d_counts,uint *ll_lengths,uint *d_lengths,
                 ZopfliLZ77Store *lz77,size_t lstart,size_t lend)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  
  if (lend < lstart + 0x360) {
    sVar5 = CalculateBlockSymbolSizeSmall(ll_lengths,d_lengths,lz77,lstart,lend);
    return sVar5;
  }
  lVar6 = 0;
  lVar7 = 0;
  lVar8 = 0;
  do {
    uVar2 = *(ulong *)(ll_lengths + lVar6);
    uVar4 = ll_counts[lVar6];
    uVar9 = (ll_counts + lVar6)[1];
    lVar7 = ((uVar4 >> 0x20) * (uVar2 & 0xffffffff) << 0x20) +
            (uVar4 & 0xffffffff) * (uVar2 & 0xffffffff) + lVar7;
    lVar8 = ((uVar9 >> 0x20) * (uVar2 >> 0x20) << 0x20) +
            (uVar9 & 0xffffffff) * (uVar2 >> 0x20) + lVar8;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0x100);
  lVar8 = lVar8 + lVar7;
  lVar6 = 0;
  do {
    lVar8 = lVar8 + ((long)*(int *)((long)&ZopfliGetLengthSymbolExtraBits_table + lVar6) +
                    (ulong)*(uint *)((long)ll_lengths + lVar6 + 0x404)) *
                    *(long *)((long)ll_counts + lVar6 * 2 + 0x808);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x74);
  lVar7 = 0;
  lVar6 = 0;
  do {
    puVar1 = (ulong *)((long)d_counts + lVar6 * 2);
    uVar2 = *puVar1;
    uVar4 = puVar1[1];
    lVar3 = *(long *)((long)&ZopfliGetDistSymbolExtraBits_table + lVar6);
    auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar10._0_8_ = lVar3;
    auVar10._12_4_ = -(uint)(lVar3 < 0);
    uVar9 = CONCAT44(-(uint)((int)lVar3 < 0),(int)lVar3) +
            (*(ulong *)((long)d_lengths + lVar6) & 0xffffffff);
    uVar11 = auVar10._8_8_ + (*(ulong *)((long)d_lengths + lVar6) >> 0x20);
    lVar8 = lVar8 + (uVar9 & 0xffffffff) * (uVar2 & 0xffffffff) +
            ((uVar9 >> 0x20) * (uVar2 & 0xffffffff) + (uVar2 >> 0x20) * (uVar9 & 0xffffffff) << 0x20
            );
    lVar7 = lVar7 + (uVar11 & 0xffffffff) * (uVar4 & 0xffffffff) +
            ((uVar11 >> 0x20) * (uVar4 & 0xffffffff) + (uVar4 >> 0x20) * (uVar11 & 0xffffffff) <<
            0x20);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x78);
  return (ulong)ll_lengths[0x100] + lVar7 + lVar8;
}

Assistant:

static size_t CalculateBlockSymbolSizeGivenCounts(const size_t* ll_counts,
                                                  const size_t* d_counts,
                                                  const unsigned* ll_lengths,
                                                  const unsigned* d_lengths,
                                                  const ZopfliLZ77Store* lz77,
                                                  size_t lstart, size_t lend) {
  size_t result = 0;
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    return CalculateBlockSymbolSizeSmall(
        ll_lengths, d_lengths, lz77, lstart, lend);
  } else {
    for (i = 0; i < 256; i++) {
      result += ll_lengths[i] * ll_counts[i];
    }
    for (i = 257; i < 286; i++) {
      result += ll_lengths[i] * ll_counts[i];
      result += ZopfliGetLengthSymbolExtraBits(i) * ll_counts[i];
    }
    for (i = 0; i < 30; i++) {
      result += d_lengths[i] * d_counts[i];
      result += ZopfliGetDistSymbolExtraBits(i) * d_counts[i];
    }
    result += ll_lengths[256]; /*end symbol*/
    return result;
  }
}